

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall
Database::Connect(Database *this,Engine type,string *host,unsigned_short port,string *user,
                 string *pass,string *db)

{
  int iVar1;
  impl_ iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  anon_union_8_2_1ccce1b9_for_impl__0 aVar5;
  undefined8 uVar6;
  pointer piVar7;
  anon_union_8_2_1ccce1b9_for_impl__0 *paVar8;
  char *pcVar9;
  Database_OpenFailed *pDVar10;
  string *pass_local;
  string *user_local;
  unsigned_short port_local;
  string *host_local;
  Engine type_local;
  Database *this_local;
  
  this->engine = type;
  std::__cxx11::string::operator=((string *)&this->host,(string *)host);
  std::__cxx11::string::operator=((string *)&this->user,(string *)user);
  std::__cxx11::string::operator=((string *)&this->pass,(string *)pass);
  this->port = (uint)port;
  std::__cxx11::string::operator=((string *)&this->db,(string *)db);
  if ((this->connected & 1U) == 0) {
    if (type == MySQL) {
      iVar2.field_0 = (anon_union_8_2_1ccce1b9_for_impl__0)mysql_init(0);
      paVar8 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                          (&this->impl)->field_0;
      *paVar8 = iVar2.field_0;
      if (iVar2.field_0 == (MYSQL *)0x0) {
        pDVar10 = (Database_OpenFailed *)__cxa_allocate_exception(0x10);
        paVar8 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                  operator->(&this->impl)->field_0;
        pcVar9 = (char *)mysql_error(paVar8->mysql_handle);
        Database_OpenFailed::Database_OpenFailed(pDVar10,pcVar9);
        __cxa_throw(pDVar10,&Database_OpenFailed::typeinfo,Database_OpenFailed::~Database_OpenFailed
                   );
      }
      paVar8 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                          (&this->impl)->field_0;
      iVar2.field_0 = (anon_union_8_2_1ccce1b9_for_impl__0)paVar8->mysql_handle;
      uVar6 = std::__cxx11::string::c_str();
      uVar3 = std::__cxx11::string::c_str();
      uVar4 = std::__cxx11::string::c_str();
      aVar5.mysql_handle =
           (MYSQL *)mysql_real_connect(iVar2.field_0,uVar6,uVar3,uVar4,0,this->port,0,0);
      paVar8 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                          (&this->impl)->field_0;
      if (aVar5.mysql_handle != paVar8->mysql_handle) {
        pDVar10 = (Database_OpenFailed *)__cxa_allocate_exception(0x10);
        paVar8 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                  operator->(&this->impl)->field_0;
        pcVar9 = (char *)mysql_error(paVar8->mysql_handle);
        Database_OpenFailed::Database_OpenFailed(pDVar10,pcVar9);
        __cxa_throw(pDVar10,&Database_OpenFailed::typeinfo,Database_OpenFailed::~Database_OpenFailed
                   );
      }
      this->connected = true;
      paVar8 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                          (&this->impl)->field_0;
      iVar2.field_0 = (anon_union_8_2_1ccce1b9_for_impl__0)paVar8->mysql_handle;
      uVar6 = std::__cxx11::string::c_str();
      iVar1 = mysql_select_db(iVar2.field_0,uVar6);
      if (iVar1 != 0) {
        Close(this);
        pDVar10 = (Database_OpenFailed *)__cxa_allocate_exception(0x10);
        paVar8 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                  operator->(&this->impl)->field_0;
        pcVar9 = (char *)mysql_error(paVar8->mysql_handle);
        Database_OpenFailed::Database_OpenFailed(pDVar10,pcVar9);
        __cxa_throw(pDVar10,&Database_OpenFailed::typeinfo,Database_OpenFailed::~Database_OpenFailed
                   );
      }
    }
    else {
      if (type != SQLite) {
        pDVar10 = (Database_OpenFailed *)__cxa_allocate_exception(0x10);
        Database_OpenFailed::Database_OpenFailed(pDVar10,"Invalid database engine.");
        __cxa_throw(pDVar10,&Database_OpenFailed::typeinfo,Database_OpenFailed::~Database_OpenFailed
                   );
      }
      iVar1 = sqlite3_libversion_number();
      if (iVar1 != 0x2e574a) {
        Console::Err(
                    "SQLite library version mismatch! Please recompile EOSERV with the correct SQLite library."
                    );
        Console::Err("  Expected version: %s","3.37.2");
        uVar6 = sqlite3_libversion();
        Console::Err("  Library version:  %s",uVar6);
        pDVar10 = (Database_OpenFailed *)__cxa_allocate_exception(0x10);
        Database_OpenFailed::Database_OpenFailed(pDVar10,"SQLite library version mismatch");
        __cxa_throw(pDVar10,&Database_OpenFailed::typeinfo,Database_OpenFailed::~Database_OpenFailed
                   );
      }
      uVar6 = std::__cxx11::string::c_str();
      piVar7 = std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                         (&this->impl);
      iVar1 = sqlite3_open(uVar6,piVar7);
      if (iVar1 != 0) {
        pDVar10 = (Database_OpenFailed *)__cxa_allocate_exception(0x10);
        paVar8 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                  operator->(&this->impl)->field_0;
        pcVar9 = (char *)sqlite3_errmsg(paVar8->mysql_handle);
        Database_OpenFailed::Database_OpenFailed(pDVar10,pcVar9);
        __cxa_throw(pDVar10,&Database_OpenFailed::typeinfo,Database_OpenFailed::~Database_OpenFailed
                   );
      }
      this->connected = true;
    }
  }
  return;
}

Assistant:

void Database::Connect(Database::Engine type, const std::string& host, unsigned short port, const std::string& user, const std::string& pass, const std::string& db)
{
	this->engine = type;
	this->host = host;
	this->user = user;
	this->pass = pass;
	this->port = port;
	this->db = db;

	if (this->connected)
	{
		return;
	}

	switch (type)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
			if ((this->impl->mysql_handle = mysql_init(0)) == 0)
			{
				throw Database_OpenFailed(mysql_error(this->impl->mysql_handle));
			}

// Linux uses the ABI version number as part of the shared library name
#ifdef WIN32
			if (mysql_get_client_version() != MYSQL_VERSION_ID)
			{
				unsigned int client_version = mysql_get_client_version();

				Console::Err("MySQL client library version mismatch! Please recompile EOSERV with the correct MySQL client library.");
				Console::Err("  Expected version: %i.%i.%i", (MYSQL_VERSION_ID) / 10000, ((MYSQL_VERSION_ID) / 100) % 100, (MYSQL_VERSION_ID) % 100);
				Console::Err("  Library version:  %i.%i.%i", (client_version) / 10000, ((client_version) / 100) % 100, (client_version) % 100);
				Console::Err("Make sure EOSERV is using the correct version of libmariadb.dll");
				throw Database_OpenFailed("MySQL client library version mismatch");
			}
#endif

			if (mysql_real_connect(this->impl->mysql_handle, host.c_str(), user.c_str(), pass.c_str(), 0, this->port, 0, 0) != this->impl->mysql_handle)
			{
				throw Database_OpenFailed(mysql_error(this->impl->mysql_handle));
			}

// This check isn't really neccessary for EOSERV
#if 0
			if ((mysql_get_server_version(this->impl->mysql_handle) / 100) != (MYSQL_VERSION_ID) / 100)
			{
				Console::Wrn("MySQL server version mismatch.");
				Console::Wrn("  Server version: %s", mysql_get_server_info(this->impl->mysql_handle));
				Console::Wrn("  Client version: %s", mysql_get_client_info());
			}
#endif

			this->connected = true;

			if (mysql_select_db(this->impl->mysql_handle, db.c_str()) != 0)
			{
				this->Close();
				throw Database_OpenFailed(mysql_error(this->impl->mysql_handle));
			}

			break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			if (sqlite3_libversion_number() != SQLITE_VERSION_NUMBER)
			{
				Console::Err("SQLite library version mismatch! Please recompile EOSERV with the correct SQLite library.");
				Console::Err("  Expected version: %s", SQLITE_VERSION);
				Console::Err("  Library version:  %s", sqlite3_libversion());
#ifdef WIN32
				Console::Err("Make sure EOSERV is using the correct version of sqlite3.dll");
#endif // WIN32
				throw Database_OpenFailed("SQLite library version mismatch");
			}

			if (sqlite3_open(host.c_str(), &this->impl->sqlite_handle) != SQLITE_OK)
			{
				throw Database_OpenFailed(sqlite3_errmsg(this->impl->sqlite_handle));
			}

			this->connected = true;

			break;
#endif // DATABASE_SQLITE

		default:
			throw Database_OpenFailed("Invalid database engine.");
	}
}